

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrientationError.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::OrientationError::Decode(OrientationError *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KString local_40;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (5 < KVar1) {
    (*(this->m_AziErr).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_AziErr,stream);
    (*(this->m_ElvErr).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_ElvErr,stream);
    (*(this->m_RotErr).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_RotErr,stream);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Decode","");
  KException::KException(this_00,&local_40,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void OrientationError::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < ORIENTATION_ERROR_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> KDIS_STREAM m_AziErr
           >> KDIS_STREAM m_ElvErr
           >> KDIS_STREAM m_RotErr;
}